

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

int64 google::protobuf::util::TimeUtil::TimestampToMicroseconds(Timestamp *timestamp)

{
  long lVar1;
  
  lVar1 = (long)timestamp->nanos_;
  return lVar1 / 1000 + timestamp->seconds_ * 1000000 + (ulong)(0 < lVar1 % 1000 && lVar1 < -999);
}

Assistant:

int64 TimeUtil::TimestampToMicroseconds(const Timestamp& timestamp) {
  return timestamp.seconds() * kMicrosPerSecond +
         RoundTowardZero(timestamp.nanos(), kNanosPerMicrosecond);
}